

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::bindTextureToSampler
          (GLSLTestBase *this,program *program,texture *texture,GLchar *uniform_name)

{
  int iVar1;
  deUint32 dVar2;
  GLint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  GLint location;
  Functions *gl;
  GLchar *uniform_name_local;
  texture *texture_local;
  program *program_local;
  GLSLTestBase *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestBase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 8))(0x84c0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  iVar1 = 0x2a5dee1;
  __len = 0x78e;
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x78e);
  Utils::texture::bind(texture,iVar1,__addr,__len);
  GVar3 = Utils::program::getUniformLocation(program,uniform_name);
  (**(code **)(lVar5 + 0x14f0))(GVar3,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x794);
  return;
}

Assistant:

void GLSLTestBase::bindTextureToSampler(Utils::program& program, Utils::texture& texture,
										const glw::GLchar* uniform_name) const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	texture.bind();

	GLint location = program.getUniformLocation(uniform_name);
	gl.uniform1i(location, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
}